

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O1

void Dch_ClassesCheck(Dch_Cla_t *p)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  long lVar6;
  int iVar7;
  Aig_Obj_t *pAVar8;
  int iVar9;
  int iVar10;
  Aig_Obj_t *pAVar11;
  long lVar12;
  Aig_Obj_t *pAVar13;
  long lVar14;
  
  pAVar2 = p->pAig;
  iVar1 = pAVar2->vObjs->nSize;
  lVar6 = (long)iVar1;
  iVar10 = 0;
  iVar7 = 0;
  if (0 < lVar6) {
    lVar12 = 0;
    iVar7 = 0;
    iVar10 = 0;
    do {
      ppAVar3 = p->pId2Class[lVar12];
      if (ppAVar3 != (Aig_Obj_t **)0x0) {
        pAVar13 = *ppAVar3;
        iVar9 = pAVar13->Id;
        if (0 < (long)p->pClassSizes[iVar9]) {
          lVar14 = 0;
          pAVar8 = (Aig_Obj_t *)0x0;
          do {
            pAVar4 = p->pId2Class[iVar9][lVar14];
            if (pAVar4 != (Aig_Obj_t *)0x0) {
              if (lVar14 == 0) {
                pAVar8 = pAVar4;
                if ((pAVar2->pReprs != (Aig_Obj_t **)0x0) &&
                   (pAVar2->pReprs[pAVar4->Id] != (Aig_Obj_t *)0x0)) {
                  __assert_fail("Aig_ObjRepr(p->pAig, pObj) == NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                                ,0xfc,"void Dch_ClassesCheck(Dch_Cla_t *)");
                }
              }
              else {
                if (pAVar2->pReprs == (Aig_Obj_t **)0x0) {
                  pAVar11 = (Aig_Obj_t *)0x0;
                }
                else {
                  pAVar11 = pAVar2->pReprs[pAVar4->Id];
                }
                if (pAVar11 != pAVar13) {
                  __assert_fail("Aig_ObjRepr(p->pAig, pObj) == ppClass[0]",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                                ,0xff,"void Dch_ClassesCheck(Dch_Cla_t *)");
                }
                if (pAVar4->Id <= pAVar8->Id) {
                  __assert_fail("pPrev->Id < pObj->Id",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                                ,0x100,"void Dch_ClassesCheck(Dch_Cla_t *)");
                }
                iVar10 = iVar10 + 1;
                pAVar8 = pAVar4;
              }
            }
            lVar14 = lVar14 + 1;
          } while (p->pClassSizes[iVar9] != lVar14);
        }
        iVar7 = iVar7 + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar6);
  }
  iVar9 = 0;
  if (0 < iVar1) {
    lVar12 = 0;
    iVar9 = 0;
    do {
      pvVar5 = pAVar2->vObjs->pArray[lVar12];
      if (pvVar5 != (void *)0x0) {
        if (pAVar2->pReprs == (Aig_Obj_t **)0x0) {
          pAVar13 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar13 = pAVar2->pReprs[*(int *)((long)pvVar5 + 0x24)];
        }
        iVar9 = iVar9 + (uint)(pAVar13 == pAVar2->pConst1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar6 != lVar12);
  }
  if (p->nLits != iVar10) {
    __assert_fail("p->nLits == nLits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                  ,0x10a,"void Dch_ClassesCheck(Dch_Cla_t *)");
  }
  if (p->nCands1 != iVar9) {
    __assert_fail("p->nCands1 == nCands1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                  ,0x10b,"void Dch_ClassesCheck(Dch_Cla_t *)");
  }
  if (p->nClasses != iVar7) {
    __assert_fail("p->nClasses == nClasses",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                  ,0x10c,"void Dch_ClassesCheck(Dch_Cla_t *)");
  }
  return;
}

Assistant:

void Dch_ClassesCheck( Dch_Cla_t * p )
{
    Aig_Obj_t * pObj, * pPrev, ** ppClass;
    int i, k, nLits, nClasses, nCands1;
    nClasses = nLits = 0;
    Dch_ManForEachClass( p, ppClass, k )
    {
        pPrev = NULL;
        Dch_ClassForEachNode( p, ppClass[0], pObj, i )
        {
            if ( i == 0 )
                assert( Aig_ObjRepr(p->pAig, pObj) == NULL );
            else
            {
                assert( Aig_ObjRepr(p->pAig, pObj) == ppClass[0] );
                assert( pPrev->Id < pObj->Id );
                nLits++;
            }
            pPrev = pObj;
        }
        nClasses++;
    }
    nCands1 = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
        nCands1 += Dch_ObjIsConst1Cand( p->pAig, pObj );
    assert( p->nLits == nLits );
    assert( p->nCands1 == nCands1 );
    assert( p->nClasses == nClasses );
}